

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void arb1_texbem(Context *ctx,int luminance)

{
  uint regnum;
  size_t in_RCX;
  size_t in_RDX;
  size_t buflen;
  size_t in_R8;
  char sampler [64];
  char tmp [64];
  char src [64];
  char dst [64];
  
  regnum = (ctx->dest_arg).regnum;
  get_ARB1_destarg_varname(ctx,dst,in_RDX);
  get_ARB1_srcarg_varname(ctx,0,src,in_RCX);
  allocate_ARB1_scratch_reg_name(ctx,tmp,buflen);
  get_D3D_varname_in_buf(ctx,REG_TYPE_SAMPLER,regnum,sampler,in_R8);
  output_line(ctx,"MUL %s, %s_texbem.xzyw, %s.xyxy;",tmp,sampler,src);
  output_line(ctx,"ADD %s.xy, %s.xzxx, %s.ywxx;",tmp,tmp,tmp);
  output_line(ctx,"ADD %s.xy, %s, %s;",tmp,tmp,dst);
  output_line(ctx,"TEX %s, %s, texture[%d], 2D;",dst,tmp,(ulong)regnum);
  if (luminance != 0) {
    output_line(ctx,"MAD %s, %s.zzzz, %s_texbeml.xxxx, %s_texbeml.yyyy;",tmp,src,sampler,sampler);
    output_line(ctx,"MUL %s, %s, %s;",dst,dst,tmp);
  }
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void arb1_texbem(Context *ctx, const int luminance)
{
    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    char src[64]; get_ARB1_srcarg_varname(ctx, 0, src, sizeof (src));
    char tmp[64]; allocate_ARB1_scratch_reg_name(ctx, tmp, sizeof (tmp));
    char sampler[64];
    get_ARB1_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage,
                            sampler, sizeof (sampler));

    output_line(ctx, "MUL %s, %s_texbem.xzyw, %s.xyxy;", tmp, sampler, src);
    output_line(ctx, "ADD %s.xy, %s.xzxx, %s.ywxx;", tmp, tmp, tmp);
    output_line(ctx, "ADD %s.xy, %s, %s;", tmp, tmp, dst);
    output_line(ctx, "TEX %s, %s, texture[%d], 2D;", dst, tmp, stage);

    if (luminance)  // TEXBEML, not just TEXBEM?
    {
        output_line(ctx, "MAD %s, %s.zzzz, %s_texbeml.xxxx, %s_texbeml.yyyy;",
                    tmp, src, sampler, sampler);
        output_line(ctx, "MUL %s, %s, %s;", dst, dst, tmp);
    } // if

    emit_ARB1_dest_modifiers(ctx);
}